

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::Builder::~Builder(Builder *this)

{
  void *pvVar1;
  bool bVar2;
  size_type sVar3;
  reference ppFVar4;
  long lVar5;
  long lVar6;
  size_type in_RDI;
  FileMetaData *f;
  uint32_t i;
  const_iterator it;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> to_unref;
  FileSet *added;
  int level;
  set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_ffffffffffffff78;
  Version *in_stack_ffffffffffffff80;
  value_type *in_stack_ffffffffffffff88;
  value_type in_stack_ffffffffffffff90;
  value_type pFVar7;
  value_type in_stack_ffffffffffffffb0;
  uint local_44;
  _Self local_40;
  _Self local_38;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> local_30;
  void *local_18;
  int local_c;
  
  for (local_c = 0; local_c < 7; local_c = local_c + 1) {
    local_18 = *(void **)(in_RDI + (long)local_c * 0x38 + 0x40);
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)0x12e9c7
              );
    std::
    set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
    ::size((set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
            *)0x12e9d1);
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               in_stack_ffffffffffffffb0,in_RDI);
    local_38._M_node =
         (_Base_ptr)
         std::
         set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
         ::begin(in_stack_ffffffffffffff78);
    while( true ) {
      local_40._M_node =
           (_Base_ptr)
           std::
           set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
           ::end(in_stack_ffffffffffffff78);
      bVar2 = std::operator!=(&local_38,&local_40);
      pvVar1 = local_18;
      if (!bVar2) break;
      std::_Rb_tree_const_iterator<leveldb::FileMetaData_*>::operator*
                ((_Rb_tree_const_iterator<leveldb::FileMetaData_*> *)0x12ea1b);
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      std::_Rb_tree_const_iterator<leveldb::FileMetaData_*>::operator++
                ((_Rb_tree_const_iterator<leveldb::FileMetaData_*> *)in_stack_ffffffffffffff80);
    }
    if (local_18 != (void *)0x0) {
      std::
      set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
      ::~set((set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
              *)0x12ea4e);
      operator_delete(pvVar1,0x30);
    }
    for (local_44 = 0;
        sVar3 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                          (&local_30), local_44 < sVar3; local_44 = local_44 + 1) {
      ppFVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](&local_30,(ulong)local_44);
      pFVar7 = *ppFVar4;
      pFVar7->refs = pFVar7->refs + -1;
      in_stack_ffffffffffffffb0 = pFVar7;
      if ((pFVar7->refs < 1) && (in_stack_ffffffffffffff90 = pFVar7, pFVar7 != (value_type)0x0)) {
        FileMetaData::~FileMetaData((FileMetaData *)in_stack_ffffffffffffff80);
        operator_delete(pFVar7,0x58);
        in_stack_ffffffffffffff90 = pFVar7;
      }
    }
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               in_stack_ffffffffffffff90);
  }
  Version::Unref(in_stack_ffffffffffffff80);
  lVar5 = in_RDI + 0x10;
  lVar6 = in_RDI + 0x198;
  do {
    lVar6 = lVar6 + -0x38;
    LevelState::~LevelState((LevelState *)0x12eb43);
  } while (lVar6 != lVar5);
  return;
}

Assistant:

~Builder() {
    for (int level = 0; level < config::kNumLevels; level++) {
      const FileSet* added = levels_[level].added_files;
      std::vector<FileMetaData*> to_unref;
      to_unref.reserve(added->size());
      for (FileSet::const_iterator it = added->begin(); it != added->end();
           ++it) {
        to_unref.push_back(*it);
      }
      delete added;
      for (uint32_t i = 0; i < to_unref.size(); i++) {
        FileMetaData* f = to_unref[i];
        f->refs--;
        if (f->refs <= 0) {
          delete f;
        }
      }
    }
    base_->Unref();
  }